

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void warp_horizontal_filter_beta0
               (uint8_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  __m128i src_00;
  int in_R8D;
  int in_R9D;
  __m128i src;
  int in_stack_00000028;
  int iy;
  __m128i coeff [4];
  int k;
  int local_a0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  __m128i *in_stack_ffffffffffffffc0;
  __m128i *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  
  prepare_horizontal_filter_coeff
            (in_R8D,in_R9D,(__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  iVar1 = -7;
  while( true ) {
    if ((int)src[1] - in_stack_00000028 < 9) {
      local_a0 = (int)src[1] - in_stack_00000028;
    }
    else {
      local_a0 = 8;
    }
    if (local_a0 <= iVar1) break;
    src_00[0]._4_4_ = iVar1;
    src_00[0]._0_4_ = in_stack_ffffffffffffffd0;
    src_00[1]._0_4_ = in_R9D;
    src_00[1]._4_4_ = in_R8D;
    filter_src_pixels(src_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4)
    ;
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

static inline void warp_horizontal_filter_beta0(
    const uint8_t *ref, __m128i *tmp, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const int offset_bits_horiz, const int reduce_bits_horiz) {
  (void)beta;
  int k;
  __m128i coeff[4];
  prepare_horizontal_filter_coeff(alpha, sx4, coeff);

  for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
    int iy = iy4 + k;
    if (iy < 0)
      iy = 0;
    else if (iy > height - 1)
      iy = height - 1;

    // Load source pixels
    const __m128i src =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    filter_src_pixels(src, tmp, coeff, offset_bits_horiz, reduce_bits_horiz, k);
  }
}